

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

nifti_image * nifti_image_read(char *hname,int read_data)

{
  nifti_1_header nhdr_00;
  int iVar1;
  int iVar2;
  char *fname_00;
  znzFile fp_00;
  nifti_image *pnVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  stat *psVar7;
  __dev_t *p_Var8;
  byte bVar9;
  znzFile fp;
  char fname [17];
  nifti_1_header nhdr;
  undefined1 in_stack_fffffffffffffce8 [344];
  znzFile local_1b0;
  char local_1a8 [32];
  stat local_188 [2];
  char local_30 [4];
  
  bVar9 = 0;
  builtin_strncpy(local_1a8,"nifti_image_read",0x11);
  if (1 < g_opts_0) {
    nifti_image_read_cold_1();
  }
  fname_00 = nifti_findhdrname(hname);
  if (fname_00 == (char *)0x0) {
    if (g_opts_0 < 1) {
      return (nifti_image *)0x0;
    }
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"failed to find header file for",hname);
    return (nifti_image *)0x0;
  }
  if (1 < g_opts_0) {
    fprintf(_stderr,"-d %s: found header filename \'%s\'\n",local_1a8,fname_00);
  }
  iVar1 = nifti_is_gzfile(fname_00);
  iVar2 = -1;
  if (((iVar1 == 0) && (*fname_00 != '\0')) && (iVar1 = stat(fname_00,local_188), iVar1 == 0)) {
    iVar2 = (int)local_188[0].st_size;
  }
  iVar1 = nifti_is_gzfile(fname_00);
  fp_00 = znzopen(fname_00,"rb",iVar1);
  local_1b0 = fp_00;
  if (fp_00 == (znzFile)0x0) {
    if (g_opts_0 < 1) goto LAB_0010da01;
    pcVar6 = "failed to open header file";
LAB_0010d978:
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,pcVar6,fname_00);
  }
  else {
    iVar1 = has_ascii_header(fp_00);
    if (iVar1 < 0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"short header read",fname_00);
      }
    }
    else {
      if (iVar1 == 1) {
        pnVar3 = nifti_read_ascii_image(fp_00,fname_00,iVar2,read_data);
        return pnVar3;
      }
      sVar4 = znzread(local_188,1,0x15c,fp_00);
      if (0x15b < (int)sVar4) {
        psVar7 = local_188;
        p_Var8 = (__dev_t *)&stack0xfffffffffffffce8;
        for (lVar5 = 0x2b; lVar5 != 0; lVar5 = lVar5 + -1) {
          *p_Var8 = psVar7->st_dev;
          psVar7 = (stat *)((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          p_Var8 = p_Var8 + (ulong)bVar9 * -2 + 1;
        }
        nhdr_00.magic[0] = local_30[0];
        nhdr_00.magic[1] = local_30[1];
        nhdr_00.magic[2] = local_30[2];
        nhdr_00.magic[3] = local_30[3];
        nhdr_00.sizeof_hdr = in_stack_fffffffffffffce8._0_4_;
        nhdr_00.data_type[0] = in_stack_fffffffffffffce8[4];
        nhdr_00.data_type[1] = in_stack_fffffffffffffce8[5];
        nhdr_00.data_type[2] = in_stack_fffffffffffffce8[6];
        nhdr_00.data_type[3] = in_stack_fffffffffffffce8[7];
        nhdr_00.data_type[4] = in_stack_fffffffffffffce8[8];
        nhdr_00.data_type[5] = in_stack_fffffffffffffce8[9];
        nhdr_00.data_type[6] = in_stack_fffffffffffffce8[10];
        nhdr_00.data_type[7] = in_stack_fffffffffffffce8[0xb];
        nhdr_00.data_type[8] = in_stack_fffffffffffffce8[0xc];
        nhdr_00.data_type[9] = in_stack_fffffffffffffce8[0xd];
        nhdr_00.db_name[0] = in_stack_fffffffffffffce8[0xe];
        nhdr_00.db_name[1] = in_stack_fffffffffffffce8[0xf];
        nhdr_00.db_name[2] = in_stack_fffffffffffffce8[0x10];
        nhdr_00.db_name[3] = in_stack_fffffffffffffce8[0x11];
        nhdr_00.db_name[4] = in_stack_fffffffffffffce8[0x12];
        nhdr_00.db_name[5] = in_stack_fffffffffffffce8[0x13];
        nhdr_00.db_name[6] = in_stack_fffffffffffffce8[0x14];
        nhdr_00.db_name[7] = in_stack_fffffffffffffce8[0x15];
        nhdr_00.db_name[8] = in_stack_fffffffffffffce8[0x16];
        nhdr_00.db_name[9] = in_stack_fffffffffffffce8[0x17];
        nhdr_00.db_name[10] = in_stack_fffffffffffffce8[0x18];
        nhdr_00.db_name[0xb] = in_stack_fffffffffffffce8[0x19];
        nhdr_00.db_name[0xc] = in_stack_fffffffffffffce8[0x1a];
        nhdr_00.db_name[0xd] = in_stack_fffffffffffffce8[0x1b];
        nhdr_00.db_name[0xe] = in_stack_fffffffffffffce8[0x1c];
        nhdr_00.db_name[0xf] = in_stack_fffffffffffffce8[0x1d];
        nhdr_00.db_name[0x10] = in_stack_fffffffffffffce8[0x1e];
        nhdr_00.db_name[0x11] = in_stack_fffffffffffffce8[0x1f];
        nhdr_00.extents = in_stack_fffffffffffffce8._32_4_;
        nhdr_00.session_error = in_stack_fffffffffffffce8._36_2_;
        nhdr_00.regular = in_stack_fffffffffffffce8[0x26];
        nhdr_00.dim_info = in_stack_fffffffffffffce8[0x27];
        nhdr_00.dim[0] = in_stack_fffffffffffffce8._40_2_;
        nhdr_00.dim[1] = in_stack_fffffffffffffce8._42_2_;
        nhdr_00.dim[2] = in_stack_fffffffffffffce8._44_2_;
        nhdr_00.dim[3] = in_stack_fffffffffffffce8._46_2_;
        nhdr_00.dim[4] = in_stack_fffffffffffffce8._48_2_;
        nhdr_00.dim[5] = in_stack_fffffffffffffce8._50_2_;
        nhdr_00.dim[6] = in_stack_fffffffffffffce8._52_2_;
        nhdr_00.dim[7] = in_stack_fffffffffffffce8._54_2_;
        nhdr_00.intent_p1 = (float)in_stack_fffffffffffffce8._56_4_;
        nhdr_00.intent_p2 = (float)in_stack_fffffffffffffce8._60_4_;
        nhdr_00.intent_p3 = (float)in_stack_fffffffffffffce8._64_4_;
        nhdr_00.intent_code = in_stack_fffffffffffffce8._68_2_;
        nhdr_00.datatype = in_stack_fffffffffffffce8._70_2_;
        nhdr_00.bitpix = in_stack_fffffffffffffce8._72_2_;
        nhdr_00.slice_start = in_stack_fffffffffffffce8._74_2_;
        nhdr_00.pixdim[0] = (float)in_stack_fffffffffffffce8._76_4_;
        nhdr_00.pixdim[1] = (float)in_stack_fffffffffffffce8._80_4_;
        nhdr_00.pixdim[2] = (float)in_stack_fffffffffffffce8._84_4_;
        nhdr_00.pixdim[3] = (float)in_stack_fffffffffffffce8._88_4_;
        nhdr_00.pixdim[4] = (float)in_stack_fffffffffffffce8._92_4_;
        nhdr_00.pixdim[5] = (float)in_stack_fffffffffffffce8._96_4_;
        nhdr_00.pixdim[6] = (float)in_stack_fffffffffffffce8._100_4_;
        nhdr_00.pixdim[7] = (float)in_stack_fffffffffffffce8._104_4_;
        nhdr_00.vox_offset = (float)in_stack_fffffffffffffce8._108_4_;
        nhdr_00.scl_slope = (float)in_stack_fffffffffffffce8._112_4_;
        nhdr_00.scl_inter = (float)in_stack_fffffffffffffce8._116_4_;
        nhdr_00.slice_end = in_stack_fffffffffffffce8._120_2_;
        nhdr_00.slice_code = in_stack_fffffffffffffce8[0x7a];
        nhdr_00.xyzt_units = in_stack_fffffffffffffce8[0x7b];
        nhdr_00.cal_max = (float)in_stack_fffffffffffffce8._124_4_;
        nhdr_00.cal_min = (float)in_stack_fffffffffffffce8._128_4_;
        nhdr_00.slice_duration = (float)in_stack_fffffffffffffce8._132_4_;
        nhdr_00.toffset = (float)in_stack_fffffffffffffce8._136_4_;
        nhdr_00.glmax = in_stack_fffffffffffffce8._140_4_;
        nhdr_00.glmin = in_stack_fffffffffffffce8._144_4_;
        nhdr_00.descrip[0] = in_stack_fffffffffffffce8[0x94];
        nhdr_00.descrip[1] = in_stack_fffffffffffffce8[0x95];
        nhdr_00.descrip[2] = in_stack_fffffffffffffce8[0x96];
        nhdr_00.descrip[3] = in_stack_fffffffffffffce8[0x97];
        nhdr_00.descrip[4] = in_stack_fffffffffffffce8[0x98];
        nhdr_00.descrip[5] = in_stack_fffffffffffffce8[0x99];
        nhdr_00.descrip[6] = in_stack_fffffffffffffce8[0x9a];
        nhdr_00.descrip[7] = in_stack_fffffffffffffce8[0x9b];
        nhdr_00.descrip[8] = in_stack_fffffffffffffce8[0x9c];
        nhdr_00.descrip[9] = in_stack_fffffffffffffce8[0x9d];
        nhdr_00.descrip[10] = in_stack_fffffffffffffce8[0x9e];
        nhdr_00.descrip[0xb] = in_stack_fffffffffffffce8[0x9f];
        nhdr_00.descrip[0xc] = in_stack_fffffffffffffce8[0xa0];
        nhdr_00.descrip[0xd] = in_stack_fffffffffffffce8[0xa1];
        nhdr_00.descrip[0xe] = in_stack_fffffffffffffce8[0xa2];
        nhdr_00.descrip[0xf] = in_stack_fffffffffffffce8[0xa3];
        nhdr_00.descrip[0x10] = in_stack_fffffffffffffce8[0xa4];
        nhdr_00.descrip[0x11] = in_stack_fffffffffffffce8[0xa5];
        nhdr_00.descrip[0x12] = in_stack_fffffffffffffce8[0xa6];
        nhdr_00.descrip[0x13] = in_stack_fffffffffffffce8[0xa7];
        nhdr_00.descrip[0x14] = in_stack_fffffffffffffce8[0xa8];
        nhdr_00.descrip[0x15] = in_stack_fffffffffffffce8[0xa9];
        nhdr_00.descrip[0x16] = in_stack_fffffffffffffce8[0xaa];
        nhdr_00.descrip[0x17] = in_stack_fffffffffffffce8[0xab];
        nhdr_00.descrip[0x18] = in_stack_fffffffffffffce8[0xac];
        nhdr_00.descrip[0x19] = in_stack_fffffffffffffce8[0xad];
        nhdr_00.descrip[0x1a] = in_stack_fffffffffffffce8[0xae];
        nhdr_00.descrip[0x1b] = in_stack_fffffffffffffce8[0xaf];
        nhdr_00.descrip[0x1c] = in_stack_fffffffffffffce8[0xb0];
        nhdr_00.descrip[0x1d] = in_stack_fffffffffffffce8[0xb1];
        nhdr_00.descrip[0x1e] = in_stack_fffffffffffffce8[0xb2];
        nhdr_00.descrip[0x1f] = in_stack_fffffffffffffce8[0xb3];
        nhdr_00.descrip[0x20] = in_stack_fffffffffffffce8[0xb4];
        nhdr_00.descrip[0x21] = in_stack_fffffffffffffce8[0xb5];
        nhdr_00.descrip[0x22] = in_stack_fffffffffffffce8[0xb6];
        nhdr_00.descrip[0x23] = in_stack_fffffffffffffce8[0xb7];
        nhdr_00.descrip[0x24] = in_stack_fffffffffffffce8[0xb8];
        nhdr_00.descrip[0x25] = in_stack_fffffffffffffce8[0xb9];
        nhdr_00.descrip[0x26] = in_stack_fffffffffffffce8[0xba];
        nhdr_00.descrip[0x27] = in_stack_fffffffffffffce8[0xbb];
        nhdr_00.descrip[0x28] = in_stack_fffffffffffffce8[0xbc];
        nhdr_00.descrip[0x29] = in_stack_fffffffffffffce8[0xbd];
        nhdr_00.descrip[0x2a] = in_stack_fffffffffffffce8[0xbe];
        nhdr_00.descrip[0x2b] = in_stack_fffffffffffffce8[0xbf];
        nhdr_00.descrip[0x2c] = in_stack_fffffffffffffce8[0xc0];
        nhdr_00.descrip[0x2d] = in_stack_fffffffffffffce8[0xc1];
        nhdr_00.descrip[0x2e] = in_stack_fffffffffffffce8[0xc2];
        nhdr_00.descrip[0x2f] = in_stack_fffffffffffffce8[0xc3];
        nhdr_00.descrip[0x30] = in_stack_fffffffffffffce8[0xc4];
        nhdr_00.descrip[0x31] = in_stack_fffffffffffffce8[0xc5];
        nhdr_00.descrip[0x32] = in_stack_fffffffffffffce8[0xc6];
        nhdr_00.descrip[0x33] = in_stack_fffffffffffffce8[199];
        nhdr_00.descrip[0x34] = in_stack_fffffffffffffce8[200];
        nhdr_00.descrip[0x35] = in_stack_fffffffffffffce8[0xc9];
        nhdr_00.descrip[0x36] = in_stack_fffffffffffffce8[0xca];
        nhdr_00.descrip[0x37] = in_stack_fffffffffffffce8[0xcb];
        nhdr_00.descrip[0x38] = in_stack_fffffffffffffce8[0xcc];
        nhdr_00.descrip[0x39] = in_stack_fffffffffffffce8[0xcd];
        nhdr_00.descrip[0x3a] = in_stack_fffffffffffffce8[0xce];
        nhdr_00.descrip[0x3b] = in_stack_fffffffffffffce8[0xcf];
        nhdr_00.descrip[0x3c] = in_stack_fffffffffffffce8[0xd0];
        nhdr_00.descrip[0x3d] = in_stack_fffffffffffffce8[0xd1];
        nhdr_00.descrip[0x3e] = in_stack_fffffffffffffce8[0xd2];
        nhdr_00.descrip[0x3f] = in_stack_fffffffffffffce8[0xd3];
        nhdr_00.descrip[0x40] = in_stack_fffffffffffffce8[0xd4];
        nhdr_00.descrip[0x41] = in_stack_fffffffffffffce8[0xd5];
        nhdr_00.descrip[0x42] = in_stack_fffffffffffffce8[0xd6];
        nhdr_00.descrip[0x43] = in_stack_fffffffffffffce8[0xd7];
        nhdr_00.descrip[0x44] = in_stack_fffffffffffffce8[0xd8];
        nhdr_00.descrip[0x45] = in_stack_fffffffffffffce8[0xd9];
        nhdr_00.descrip[0x46] = in_stack_fffffffffffffce8[0xda];
        nhdr_00.descrip[0x47] = in_stack_fffffffffffffce8[0xdb];
        nhdr_00.descrip[0x48] = in_stack_fffffffffffffce8[0xdc];
        nhdr_00.descrip[0x49] = in_stack_fffffffffffffce8[0xdd];
        nhdr_00.descrip[0x4a] = in_stack_fffffffffffffce8[0xde];
        nhdr_00.descrip[0x4b] = in_stack_fffffffffffffce8[0xdf];
        nhdr_00.descrip[0x4c] = in_stack_fffffffffffffce8[0xe0];
        nhdr_00.descrip[0x4d] = in_stack_fffffffffffffce8[0xe1];
        nhdr_00.descrip[0x4e] = in_stack_fffffffffffffce8[0xe2];
        nhdr_00.descrip[0x4f] = in_stack_fffffffffffffce8[0xe3];
        nhdr_00.aux_file[0] = in_stack_fffffffffffffce8[0xe4];
        nhdr_00.aux_file[1] = in_stack_fffffffffffffce8[0xe5];
        nhdr_00.aux_file[2] = in_stack_fffffffffffffce8[0xe6];
        nhdr_00.aux_file[3] = in_stack_fffffffffffffce8[0xe7];
        nhdr_00.aux_file[4] = in_stack_fffffffffffffce8[0xe8];
        nhdr_00.aux_file[5] = in_stack_fffffffffffffce8[0xe9];
        nhdr_00.aux_file[6] = in_stack_fffffffffffffce8[0xea];
        nhdr_00.aux_file[7] = in_stack_fffffffffffffce8[0xeb];
        nhdr_00.aux_file[8] = in_stack_fffffffffffffce8[0xec];
        nhdr_00.aux_file[9] = in_stack_fffffffffffffce8[0xed];
        nhdr_00.aux_file[10] = in_stack_fffffffffffffce8[0xee];
        nhdr_00.aux_file[0xb] = in_stack_fffffffffffffce8[0xef];
        nhdr_00.aux_file[0xc] = in_stack_fffffffffffffce8[0xf0];
        nhdr_00.aux_file[0xd] = in_stack_fffffffffffffce8[0xf1];
        nhdr_00.aux_file[0xe] = in_stack_fffffffffffffce8[0xf2];
        nhdr_00.aux_file[0xf] = in_stack_fffffffffffffce8[0xf3];
        nhdr_00.aux_file[0x10] = in_stack_fffffffffffffce8[0xf4];
        nhdr_00.aux_file[0x11] = in_stack_fffffffffffffce8[0xf5];
        nhdr_00.aux_file[0x12] = in_stack_fffffffffffffce8[0xf6];
        nhdr_00.aux_file[0x13] = in_stack_fffffffffffffce8[0xf7];
        nhdr_00.aux_file[0x14] = in_stack_fffffffffffffce8[0xf8];
        nhdr_00.aux_file[0x15] = in_stack_fffffffffffffce8[0xf9];
        nhdr_00.aux_file[0x16] = in_stack_fffffffffffffce8[0xfa];
        nhdr_00.aux_file[0x17] = in_stack_fffffffffffffce8[0xfb];
        nhdr_00.qform_code = in_stack_fffffffffffffce8._252_2_;
        nhdr_00.sform_code = in_stack_fffffffffffffce8._254_2_;
        nhdr_00.quatern_b = (float)in_stack_fffffffffffffce8._256_4_;
        nhdr_00.quatern_c = (float)in_stack_fffffffffffffce8._260_4_;
        nhdr_00.quatern_d = (float)in_stack_fffffffffffffce8._264_4_;
        nhdr_00.qoffset_x = (float)in_stack_fffffffffffffce8._268_4_;
        nhdr_00.qoffset_y = (float)in_stack_fffffffffffffce8._272_4_;
        nhdr_00.qoffset_z = (float)in_stack_fffffffffffffce8._276_4_;
        nhdr_00.srow_x[0] = (float)in_stack_fffffffffffffce8._280_4_;
        nhdr_00.srow_x[1] = (float)in_stack_fffffffffffffce8._284_4_;
        nhdr_00.srow_x[2] = (float)in_stack_fffffffffffffce8._288_4_;
        nhdr_00.srow_x[3] = (float)in_stack_fffffffffffffce8._292_4_;
        nhdr_00.srow_y[0] = (float)in_stack_fffffffffffffce8._296_4_;
        nhdr_00.srow_y[1] = (float)in_stack_fffffffffffffce8._300_4_;
        nhdr_00.srow_y[2] = (float)in_stack_fffffffffffffce8._304_4_;
        nhdr_00.srow_y[3] = (float)in_stack_fffffffffffffce8._308_4_;
        nhdr_00.srow_z[0] = (float)in_stack_fffffffffffffce8._312_4_;
        nhdr_00.srow_z[1] = (float)in_stack_fffffffffffffce8._316_4_;
        nhdr_00.srow_z[2] = (float)in_stack_fffffffffffffce8._320_4_;
        nhdr_00.srow_z[3] = (float)in_stack_fffffffffffffce8._324_4_;
        nhdr_00.intent_name[0] = in_stack_fffffffffffffce8[0x148];
        nhdr_00.intent_name[1] = in_stack_fffffffffffffce8[0x149];
        nhdr_00.intent_name[2] = in_stack_fffffffffffffce8[0x14a];
        nhdr_00.intent_name[3] = in_stack_fffffffffffffce8[0x14b];
        nhdr_00.intent_name[4] = in_stack_fffffffffffffce8[0x14c];
        nhdr_00.intent_name[5] = in_stack_fffffffffffffce8[0x14d];
        nhdr_00.intent_name[6] = in_stack_fffffffffffffce8[0x14e];
        nhdr_00.intent_name[7] = in_stack_fffffffffffffce8[0x14f];
        nhdr_00.intent_name[8] = in_stack_fffffffffffffce8[0x150];
        nhdr_00.intent_name[9] = in_stack_fffffffffffffce8[0x151];
        nhdr_00.intent_name[10] = in_stack_fffffffffffffce8[0x152];
        nhdr_00.intent_name[0xb] = in_stack_fffffffffffffce8[0x153];
        nhdr_00.intent_name[0xc] = in_stack_fffffffffffffce8[0x154];
        nhdr_00.intent_name[0xd] = in_stack_fffffffffffffce8[0x155];
        nhdr_00.intent_name[0xe] = in_stack_fffffffffffffce8[0x156];
        nhdr_00.intent_name[0xf] = in_stack_fffffffffffffce8[0x157];
        pnVar3 = nifti_convert_nhdr2nim(nhdr_00,fname_00);
        if (pnVar3 != (nifti_image *)0x0) {
          if (3 < g_opts_0) {
            nifti_image_read_cold_2();
          }
          if (local_30[1] == '+') {
            iVar2 = pnVar3->iname_offset;
          }
          nifti_read_extensions(pnVar3,local_1b0,iVar2 + -0x15c);
          Xznzclose(&local_1b0);
          free(fname_00);
          if (read_data != 0) {
            iVar2 = nifti_image_load(pnVar3);
            if (iVar2 < 0) {
              nifti_image_free(pnVar3);
              return (nifti_image *)0x0;
            }
            return pnVar3;
          }
          pnVar3->data = (void *)0x0;
          return pnVar3;
        }
        Xznzclose(&local_1b0);
        if (g_opts_0 < 1) goto LAB_0010da01;
        pcVar6 = "cannot create nifti image from header";
        goto LAB_0010d978;
      }
      if (0 < g_opts_0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"bad binary header read for file",
                fname_00);
        fprintf(_stderr,"  - read %d of %d bytes\n",sVar4 & 0xffffffff,0x15c);
      }
    }
    Xznzclose(&local_1b0);
  }
LAB_0010da01:
  free(fname_00);
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_read( const char *hname , int read_data )
{
   struct nifti_1_header  nhdr ;
   nifti_image           *nim ;
   znzFile                fp ;
   int                    rv, ii , filesize, remaining;
   char                   fname[] = { "nifti_image_read" };
   char                  *hfile=NULL;

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d image_read from '%s', read_data = %d",hname,read_data);
#ifdef HAVE_ZLIB
      fprintf(stderr,", HAVE_ZLIB = 1\n");
#else
      fprintf(stderr,", HAVE_ZLIB = 0\n");
#endif
   }

   /**- determine filename to use for header */
   hfile = nifti_findhdrname(hname);
   if( hfile == NULL ){
      if(g_opts.debug > 0)
         LNI_FERR(fname,"failed to find header file for", hname);
      return NULL;  /* check return */
   } else if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: found header filename '%s'\n",fname,hfile);

   if( nifti_is_gzfile(hfile) ) filesize = -1;  /* unknown */
   else                         filesize = nifti_get_filesize(hfile);

   fp = znzopen(hfile, "rb", nifti_is_gzfile(hfile));
   if( znz_isnull(fp) ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"failed to open header file",hfile);
      free(hfile);
      return NULL;
   }

   rv = has_ascii_header( fp );
   if( rv < 0 ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"short header read",hfile);
      znzclose( fp );
      free(hfile);
      return NULL;
   }
   else if ( rv == 1 )  /* process special file type */
      return nifti_read_ascii_image( fp, hfile, filesize, read_data );

   /* else, just process normally */

   /**- read binary header */

   ii = (int)znzread( &nhdr , 1 , sizeof(nhdr) , fp ) ;       /* read the thing */

   /* keep file open so we can check for exts. after nifti_convert_nhdr2nim() */

   if( ii < (int) sizeof(nhdr) ){
      if( g_opts.debug > 0 ){
         LNI_FERR(fname,"bad binary header read for file", hfile);
         fprintf(stderr,"  - read %d of %d bytes\n",ii, (int)sizeof(nhdr));
      }
      znzclose(fp) ;
      free(hfile);
      return NULL;
   }

   /* create output image struct and set it up */

   /**- convert all nhdr fields to nifti_image fields */
   nim = nifti_convert_nhdr2nim(nhdr,hfile);

   if( nim == NULL ){
      znzclose( fp ) ;                                   /* close the file */
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"cannot create nifti image from header",hfile);
      free(hfile); /* had to save this for debug message */
      return NULL;
   }

   if( g_opts.debug > 3 ){
      fprintf(stderr,"+d nifti_image_read(), have nifti image:\n");
      if( g_opts.debug > 2 ) nifti_image_infodump(nim);
   }

   /**- check for extensions (any errors here means no extensions) */
   if( NIFTI_ONEFILE(nhdr) ) remaining = nim->iname_offset - sizeof(nhdr);
   else                      remaining = filesize - sizeof(nhdr);

   (void)nifti_read_extensions(nim, fp, remaining);

   znzclose( fp ) ;                                      /* close the file */
   free(hfile);

   /**- read the data if desired, then bug out */
   if( read_data ){
      if( nifti_image_load( nim ) < 0 ){
         nifti_image_free(nim);          /* take ball, go home. */
         return NULL;
      }
   }
   else nim->data = NULL ;

   return nim ;
}